

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O3

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_useRowMatchFinderMode_e useRowMatchFinder,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  void *pvVar2;
  rawSeq *prVar3;
  undefined8 *puVar4;
  BYTE *pBVar5;
  undefined8 *puVar6;
  BYTE *pBVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar11;
  BYTE *pBVar12;
  seqDef *psVar13;
  ZSTD_dictMode_e dictMode;
  uint uVar14;
  uint uVar15;
  undefined8 *puVar16;
  ulong uVar17;
  BYTE *litEnd;
  long lVar18;
  ulong uVar20;
  ulong uVar21;
  BYTE *litLimit_w;
  U32 UVar19;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
      dictMode = ZSTD_noDict;
    }
    else {
      dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
    }
  }
  uVar10 = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (ZSTD_btlazy2 < (ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar11;
  }
  pvVar2 = (void *)(srcSize + (long)src);
  uVar20 = rawSeqStore->pos;
  if (0 < (long)srcSize && uVar20 < rawSeqStore->size) {
    puVar1 = (undefined8 *)((long)pvVar2 - 0x20);
    while( true ) {
      prVar3 = rawSeqStore->seq + uVar20;
      uVar21._0_4_ = prVar3->offset;
      uVar21._4_4_ = prVar3->litLength;
      uVar17 = uVar21 >> 0x20;
      uVar15 = rawSeqStore->seq[uVar20].matchLength;
      uVar9 = (uint)((long)pvVar2 - (long)src);
      if (uVar9 < uVar15 + uVar21._4_4_) {
        uVar20 = uVar21;
        if (uVar9 - uVar21._4_4_ < uVar10) {
          uVar20 = 0;
        }
        uVar14 = uVar9 - uVar21._4_4_;
        if (uVar9 < (uint)uVar21._4_4_ || uVar9 - uVar21._4_4_ == 0) {
          uVar20 = 0;
          uVar14 = uVar15;
        }
        uVar15 = uVar14;
        ZSTD_ldm_skipSequences(rawSeqStore,(long)pvVar2 - (long)src & 0xffffffff,uVar10);
        uVar21 = uVar20;
      }
      else {
        rawSeqStore->pos = uVar20 + 1;
      }
      UVar19 = (U32)uVar21;
      if (UVar19 == 0) break;
      uVar9 = (int)src - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar9) {
        uVar14 = (uVar9 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar14) {
          uVar14 = 0x200;
        }
        ms->nextToUpdate = uVar9 - uVar14;
      }
      ZSTD_ldm_fillFastTables(ms,src);
      sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar17);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      puVar4 = (undefined8 *)(uVar17 + (long)src);
      *rep = UVar19;
      puVar16 = (undefined8 *)((long)puVar4 - sVar11);
      pBVar7 = seqStore->lit;
      if (puVar1 < puVar4) {
        pBVar12 = pBVar7;
        if (puVar16 <= puVar1) {
          lVar18 = (long)puVar1 - (long)puVar16;
          pBVar12 = pBVar7 + lVar18;
          uVar8 = puVar16[1];
          *(undefined8 *)pBVar7 = *puVar16;
          *(undefined8 *)(pBVar7 + 8) = uVar8;
          puVar16 = puVar1;
          if (0x10 < lVar18) {
            lVar18 = 0x10;
            do {
              puVar6 = (undefined8 *)((long)src + lVar18 + (uVar17 - sVar11));
              uVar8 = puVar6[1];
              pBVar5 = pBVar7 + lVar18;
              *(undefined8 *)pBVar5 = *puVar6;
              *(undefined8 *)(pBVar5 + 8) = uVar8;
              puVar6 = (undefined8 *)((long)src + lVar18 + (uVar17 - sVar11) + 0x10);
              uVar8 = puVar6[1];
              *(undefined8 *)(pBVar5 + 0x10) = *puVar6;
              *(undefined8 *)(pBVar5 + 0x18) = uVar8;
              lVar18 = lVar18 + 0x20;
            } while (pBVar5 + 0x20 < pBVar12);
          }
        }
        if (puVar16 < puVar4) {
          lVar18 = 0;
          do {
            pBVar12[lVar18] = *(BYTE *)((long)puVar16 + lVar18);
            lVar18 = lVar18 + 1;
          } while ((long)puVar4 - (long)puVar16 != lVar18);
        }
LAB_00209a7b:
        seqStore->lit = seqStore->lit + sVar11;
        psVar13 = seqStore->sequences;
        if (0xffff < sVar11) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar8 = puVar16[1];
        *(undefined8 *)pBVar7 = *puVar16;
        *(undefined8 *)(pBVar7 + 8) = uVar8;
        pBVar7 = seqStore->lit;
        if (0x10 < sVar11) {
          uVar8 = puVar16[3];
          *(undefined8 *)(pBVar7 + 0x10) = puVar16[2];
          *(undefined8 *)(pBVar7 + 0x18) = uVar8;
          if (0x20 < (long)sVar11) {
            lVar18 = 0;
            do {
              puVar16 = (undefined8 *)((long)src + lVar18 + (uVar17 - sVar11) + 0x20);
              uVar8 = puVar16[1];
              pBVar12 = pBVar7 + lVar18 + 0x20;
              *(undefined8 *)pBVar12 = *puVar16;
              *(undefined8 *)(pBVar12 + 8) = uVar8;
              puVar16 = (undefined8 *)((long)src + lVar18 + (uVar17 - sVar11) + 0x30);
              uVar8 = puVar16[1];
              *(undefined8 *)(pBVar12 + 0x10) = *puVar16;
              *(undefined8 *)(pBVar12 + 0x18) = uVar8;
              lVar18 = lVar18 + 0x20;
            } while (pBVar12 + 0x20 < pBVar7 + sVar11);
          }
          goto LAB_00209a7b;
        }
        seqStore->lit = pBVar7 + sVar11;
        psVar13 = seqStore->sequences;
      }
      psVar13->litLength = (U16)sVar11;
      psVar13->offset = UVar19 + 3;
      if (0xffff < uVar15 - 3) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar13->matchLength = (U16)(uVar15 - 3);
      seqStore->sequences = psVar13 + 1;
      src = (void *)((long)puVar4 + (ulong)uVar15);
      uVar20 = rawSeqStore->pos;
      if ((rawSeqStore->size <= uVar20) || (pvVar2 <= src)) break;
    }
  }
  uVar10 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar10) {
    uVar15 = (uVar10 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar15) {
      uVar15 = 0x200;
    }
    ms->nextToUpdate = uVar10 - uVar15;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)pvVar2 - (long)src);
  return sVar11;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}